

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

char * SHA512_End(SHA512_CTX *context,char *buffer)

{
  sha2_byte *d;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  
  if (context == (SHA512_CTX *)0x0) {
    __assert_fail("context != (SHA512_CTX*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x3b9,"char *SHA512_End(SHA512_CTX *, char *)");
  }
  if (buffer != (char *)0x0) {
    SHA512_Last(context);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])context->state);
    vmovdqa64_avx512f(_DAT_00124d00);
    auVar2 = vpshufb_avx512bw(auVar1,_DAT_00124c80);
    auVar1 = vmovdqu64_avx512f(auVar2);
    *(undefined1 (*) [64])context->state = auVar1;
    vmovdqu64_avx512f(auVar2);
    auVar2 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar2);
    *(undefined1 (*) [64])(context->buffer + 0x40) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar2);
    *(undefined1 (*) [64])(context->buffer + 0x30) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar2);
    context->bitcount[0] = auVar1._0_8_;
    context->bitcount[1] = auVar1._8_8_;
    context->buffer[0] = auVar1[0x10];
    context->buffer[1] = auVar1[0x11];
    context->buffer[2] = auVar1[0x12];
    context->buffer[3] = auVar1[0x13];
    context->buffer[4] = auVar1[0x14];
    context->buffer[5] = auVar1[0x15];
    context->buffer[6] = auVar1[0x16];
    context->buffer[7] = auVar1[0x17];
    context->buffer[8] = auVar1[0x18];
    context->buffer[9] = auVar1[0x19];
    context->buffer[10] = auVar1[0x1a];
    context->buffer[0xb] = auVar1[0x1b];
    context->buffer[0xc] = auVar1[0x1c];
    context->buffer[0xd] = auVar1[0x1d];
    context->buffer[0xe] = auVar1[0x1e];
    context->buffer[0xf] = auVar1[0x1f];
    context->buffer[0x10] = auVar1[0x20];
    context->buffer[0x11] = auVar1[0x21];
    context->buffer[0x12] = auVar1[0x22];
    context->buffer[0x13] = auVar1[0x23];
    context->buffer[0x14] = auVar1[0x24];
    context->buffer[0x15] = auVar1[0x25];
    context->buffer[0x16] = auVar1[0x26];
    context->buffer[0x17] = auVar1[0x27];
    context->buffer[0x18] = auVar1[0x28];
    context->buffer[0x19] = auVar1[0x29];
    context->buffer[0x1a] = auVar1[0x2a];
    context->buffer[0x1b] = auVar1[0x2b];
    context->buffer[0x1c] = auVar1[0x2c];
    context->buffer[0x1d] = auVar1[0x2d];
    context->buffer[0x1e] = auVar1[0x2e];
    context->buffer[0x1f] = auVar1[0x2f];
    context->buffer[0x20] = auVar1[0x30];
    context->buffer[0x21] = auVar1[0x31];
    context->buffer[0x22] = auVar1[0x32];
    context->buffer[0x23] = auVar1[0x33];
    context->buffer[0x24] = auVar1[0x34];
    context->buffer[0x25] = auVar1[0x35];
    context->buffer[0x26] = auVar1[0x36];
    context->buffer[0x27] = auVar1[0x37];
    context->buffer[0x28] = auVar1[0x38];
    context->buffer[0x29] = auVar1[0x39];
    context->buffer[0x2a] = auVar1[0x3a];
    context->buffer[0x2b] = auVar1[0x3b];
    context->buffer[0x2c] = auVar1[0x3c];
    context->buffer[0x2d] = auVar1[0x3d];
    context->buffer[0x2e] = auVar1[0x3e];
    context->buffer[0x2f] = auVar1[0x3f];
    auVar1 = vmovdqu64_avx512f(auVar2);
    *(undefined1 (*) [64])context->state = auVar1;
    halt_baddata();
  }
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])(context->buffer + 0x40) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])(context->buffer + 0x30) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar2);
  context->bitcount[0] = auVar1._0_8_;
  context->bitcount[1] = auVar1._8_8_;
  context->buffer[0] = auVar1[0x10];
  context->buffer[1] = auVar1[0x11];
  context->buffer[2] = auVar1[0x12];
  context->buffer[3] = auVar1[0x13];
  context->buffer[4] = auVar1[0x14];
  context->buffer[5] = auVar1[0x15];
  context->buffer[6] = auVar1[0x16];
  context->buffer[7] = auVar1[0x17];
  context->buffer[8] = auVar1[0x18];
  context->buffer[9] = auVar1[0x19];
  context->buffer[10] = auVar1[0x1a];
  context->buffer[0xb] = auVar1[0x1b];
  context->buffer[0xc] = auVar1[0x1c];
  context->buffer[0xd] = auVar1[0x1d];
  context->buffer[0xe] = auVar1[0x1e];
  context->buffer[0xf] = auVar1[0x1f];
  context->buffer[0x10] = auVar1[0x20];
  context->buffer[0x11] = auVar1[0x21];
  context->buffer[0x12] = auVar1[0x22];
  context->buffer[0x13] = auVar1[0x23];
  context->buffer[0x14] = auVar1[0x24];
  context->buffer[0x15] = auVar1[0x25];
  context->buffer[0x16] = auVar1[0x26];
  context->buffer[0x17] = auVar1[0x27];
  context->buffer[0x18] = auVar1[0x28];
  context->buffer[0x19] = auVar1[0x29];
  context->buffer[0x1a] = auVar1[0x2a];
  context->buffer[0x1b] = auVar1[0x2b];
  context->buffer[0x1c] = auVar1[0x2c];
  context->buffer[0x1d] = auVar1[0x2d];
  context->buffer[0x1e] = auVar1[0x2e];
  context->buffer[0x1f] = auVar1[0x2f];
  context->buffer[0x20] = auVar1[0x30];
  context->buffer[0x21] = auVar1[0x31];
  context->buffer[0x22] = auVar1[0x32];
  context->buffer[0x23] = auVar1[0x33];
  context->buffer[0x24] = auVar1[0x34];
  context->buffer[0x25] = auVar1[0x35];
  context->buffer[0x26] = auVar1[0x36];
  context->buffer[0x27] = auVar1[0x37];
  context->buffer[0x28] = auVar1[0x38];
  context->buffer[0x29] = auVar1[0x39];
  context->buffer[0x2a] = auVar1[0x3a];
  context->buffer[0x2b] = auVar1[0x3b];
  context->buffer[0x2c] = auVar1[0x3c];
  context->buffer[0x2d] = auVar1[0x3d];
  context->buffer[0x2e] = auVar1[0x3e];
  context->buffer[0x2f] = auVar1[0x3f];
  auVar1 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])context->state = auVar1;
  return (char *)0x0;
}

Assistant:

char *SHA512_End(SHA512_CTX* context, char buffer[SHA512_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0);

	if (buffer != (char*)0) {
		SHA512_Final(digest, context);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA512_CTX));
	}
	MEMSET_BZERO(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}